

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

ValidRowInfo * __thiscall
duckdb::StringValueScanner::TryRow
          (ValidRowInfo *__return_storage_ptr__,StringValueScanner *this,CSVState state,
          idx_t start_pos,idx_t end_pos)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  CSVState CVar1;
  char cVar2;
  char *pcVar3;
  idx_t iVar4;
  idx_t iVar5;
  bool bVar6;
  CSVStateMachine *pCVar7;
  long lVar8;
  ulong uVar9;
  CSVIterator *pCVar10;
  CSVIterator *pCVar11;
  ulong uVar12;
  idx_t to_pos;
  bool quoted;
  CSVIterator current_iterator;
  bool local_82;
  char local_81;
  idx_t local_80;
  CSVIterator local_78;
  
  pCVar10 = &(this->super_BaseScanner).iterator;
  pCVar11 = &local_78;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pCVar11->pos).buffer_idx = (pCVar10->pos).buffer_idx;
    pCVar10 = (CSVIterator *)&(pCVar10->pos).buffer_pos;
    pCVar11 = (CSVIterator *)&(pCVar11->pos).buffer_pos;
  }
  local_82 = false;
  local_78.boundary.buffer_pos = start_pos;
  local_78.boundary.end_pos = end_pos;
  bVar6 = SkipUntilState(this,state,RECORD_SEPARATOR,&local_78,&local_82);
  iVar4 = local_78.boundary.end_pos;
  local_80 = local_78.pos.buffer_pos;
  if (bVar6) {
    local_78.boundary.end_pos = (this->super_BaseScanner).iterator.boundary.end_pos;
    local_81 = IsRowValid(this,&local_78);
    if ((bool)local_81) {
      if (local_82 == false) {
        this_00 = &(this->super_BaseScanner).state_machine;
        uVar9 = 0;
        iVar5 = local_80;
        do {
          uVar12 = iVar5;
          if (iVar4 <= uVar12) {
            local_82 = false;
            goto LAB_018141ff;
          }
          pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          pcVar3 = (this->super_BaseScanner).buffer_handle_ptr;
          CVar1 = pCVar7->transition_array->state_machine[(byte)pcVar3[uVar12]][uVar9];
          uVar9 = (ulong)CVar1;
          iVar5 = uVar12 + 1;
        } while ((6 < CVar1) || ((0x62U >> (CVar1 & 0x1f) & 1) == 0));
        cVar2 = pcVar3[uVar12 - 1];
        pCVar7 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        local_82 = cVar2 == (pCVar7->dialect_options).state_machine_options.quote.value;
      }
LAB_018141ff:
      __return_storage_ptr__->is_valid = true;
      __return_storage_ptr__->start_pos = local_80;
      __return_storage_ptr__->end_buffer_idx = local_78.pos.buffer_idx;
      __return_storage_ptr__->end_pos = local_78.pos.buffer_pos;
      __return_storage_ptr__->last_state_quote = local_82;
      if (local_81 != '\0') {
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->is_valid = false;
  __return_storage_ptr__->start_pos = local_78.pos.buffer_pos;
  __return_storage_ptr__->end_buffer_idx = local_78.pos.buffer_idx;
  __return_storage_ptr__->end_pos = local_78.pos.buffer_pos;
  __return_storage_ptr__->last_state_quote = local_82;
  return __return_storage_ptr__;
}

Assistant:

ValidRowInfo StringValueScanner::TryRow(CSVState state, idx_t start_pos, idx_t end_pos) const {
	auto current_iterator = iterator;
	current_iterator.SetStart(start_pos);
	current_iterator.SetEnd(end_pos);
	bool quoted = false;
	if (SkipUntilState(state, CSVState::RECORD_SEPARATOR, current_iterator, quoted)) {
		auto iterator_start = current_iterator;
		idx_t current_pos = current_iterator.pos.buffer_pos;
		current_iterator.SetEnd(iterator.GetEndPos());
		if (IsRowValid(current_iterator)) {
			if (!quoted) {
				quoted = FirstValueEndsOnQuote(iterator_start);
			}
			return {true, current_pos, current_iterator.pos.buffer_idx, current_iterator.pos.buffer_pos, quoted};
		}
	}
	return {false, current_iterator.pos.buffer_pos, current_iterator.pos.buffer_idx, current_iterator.pos.buffer_pos,
	        quoted};
}